

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_data.cpp
# Opt level: O2

bool __thiscall
Am_Object_Data::notify_unique(Am_Object_Data *this,Am_Slot_Key key,Am_Wrapper *new_value)

{
  long lVar1;
  bool bVar2;
  ushort uVar3;
  long lVar4;
  
  lVar4 = 0;
  while( true ) {
    if ((this->data).length == (uint)lVar4) {
      propagate_unique(this,key,new_value);
      return false;
    }
    lVar1 = *(long *)((this->data).data + lVar4 * 8);
    if (*(Am_Slot_Key *)(lVar1 + 0x30) == key) break;
    lVar4 = lVar4 + 1;
  }
  uVar3 = *(ushort *)(lVar1 + 0x38);
  if ((uVar3 & 2) != 0) {
    if (new_value != (Am_Wrapper *)0x0) {
      new_value->refs = new_value->refs + 1;
      uVar3 = *(ushort *)(lVar1 + 0x38);
    }
    *(Am_Wrapper **)(lVar1 + 8) = new_value;
    if ((uVar3 & 1) == 0) {
      return false;
    }
    bVar2 = propagate_unique(this,key,new_value);
    if (!bVar2) {
      return false;
    }
    *(byte *)(lVar1 + 0x38) = *(byte *)(lVar1 + 0x38) & 0xfe;
    return false;
  }
  return true;
}

Assistant:

bool
Am_Object_Data::notify_unique(Am_Slot_Key key, Am_Wrapper *new_value)
{
  unsigned i;
  Am_Slot_Data **slot_array;
  Am_Slot_Data *slot;

  for (i = data.length, slot_array = (Am_Slot_Data **)data.data; i > 0;
       --i, ++slot_array) {
    slot = *slot_array;
    if (key == slot->key) {
      if (slot->flags & BIT_INHERITS) {
        if (new_value)
          new_value->Note_Reference();
        slot->value.wrapper_value = new_value;
        if (slot->flags & BIT_IS_INHERITED)
          if (propagate_unique(key, new_value))
            slot->flags &= ~BIT_IS_INHERITED;
        return false;
      } else
        return true;
    }
  }
  propagate_unique(key, new_value);
  return false;
}